

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

bool __thiscall glslang::HlslParseContext::wasFlattened(HlslParseContext *this,TIntermTyped *node)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  longlong id;
  
  if (node != (TIntermTyped *)0x0) {
    iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x18])(node);
    if (CONCAT44(extraout_var,iVar2) != 0) {
      iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x18])(node);
      id = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x180))
                     ((long *)CONCAT44(extraout_var_00,iVar2));
      bVar1 = wasFlattened(this,id);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool HlslParseContext::wasFlattened(const TIntermTyped* node) const
{
    return node != nullptr && node->getAsSymbolNode() != nullptr &&
           wasFlattened(node->getAsSymbolNode()->getId());
}